

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<std::unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
::expand(Stack<std::unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>_>
         *this)

{
  DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *pDVar1;
  DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *pDVar2;
  unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  *in_RDI;
  size_t i;
  unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  *newStack;
  void *mem;
  size_t newCapacity;
  DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *pDVar3;
  DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *local_28;
  
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl == (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0) {
    pDVar1 = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x8;
  }
  else {
    pDVar1 = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             ((long)(in_RDI->_M_t).
                    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                    .
                    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                    ._M_head_impl << 1);
  }
  pDVar3 = pDVar1;
  pDVar2 = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)Lib::alloc((size_t)in_RDI)
  ;
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      .
      super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
      ._M_head_impl != (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0) {
    for (local_28 = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
        local_28 <
        (in_RDI->_M_t).
        super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
        .
        super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
        ._M_head_impl;
        local_28 = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   ((long)&(local_28->_map)._timestamp + 1)) {
      std::
      unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ::unique_ptr(in_RDI,(unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                           *)pDVar3);
      std::
      unique_ptr<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
      ::~unique_ptr(in_RDI);
    }
    Lib::free(in_RDI[1]._M_t.
              super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
              .
              super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
              ._M_head_impl);
  }
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = pDVar2;
  in_RDI[2]._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 ((long)&((in_RDI[1]._M_t.
                           super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                           .
                           super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                          ._M_head_impl)->_map)._timestamp +
                 (long)(in_RDI->_M_t).
                       super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                       .
                       super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                       ._M_head_impl * 8);
  in_RDI[3]._M_t.
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 ((long)&((in_RDI[1]._M_t.
                           super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                           .
                           super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                          ._M_head_impl)->_map)._timestamp + (long)pDVar1 * 8);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  .super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>.
  _M_head_impl = pDVar1;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }